

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection.cpp
# Opt level: O0

void __thiscall
ncnn::ObjectsManager::do_objects_nms
          (ObjectsManager *this,vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *objects,
          float nms,float prob_threh)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference ppSVar4;
  ObjectBox *first;
  ObjectsManager *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  SafeOrderList<ncnn::ObjectBox> *unaff_retaddr;
  ObjectBoxNmsCondition in_stack_00000008;
  ObjectBoxNmsCondition condition;
  ObjectBox *object_box;
  TObjectBoxs *object_boxs;
  int min_index;
  int start;
  SafeOrderList<ncnn::ObjectBox> *in_stack_ffffffffffffffb0;
  value_type *in_stack_ffffffffffffffb8;
  SafeOrderList<ncnn::ObjectBox> *in_stack_ffffffffffffffc0;
  value_type *local_38;
  value_type condition_00;
  
  std::vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::clear
            ((vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)0x1b1c1d);
  iVar2 = (int)in_RDI->prob_steps + -1;
  iVar3 = get_prob_index(in_RDI,in_XMM1_Da);
  for (; iVar3 <= iVar2; iVar2 = iVar2 + -1) {
    ppSVar4 = std::
              vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
              ::operator[](&in_RDI->object_boxs_table,(long)iVar2);
    condition_00 = *ppSVar4;
    bVar1 = SafeOrderList<ncnn::ObjectBox>::empty(in_stack_ffffffffffffffc0);
    if (!bVar1) {
      do {
        first = SafeOrderList<ncnn::ObjectBox>::front(in_stack_ffffffffffffffc0);
        std::vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::push_back
                  ((vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)
                   in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        SafeOrderList<ncnn::ObjectBox>::pop_front(in_stack_ffffffffffffffb0);
        in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffc0;
        ObjectBoxNmsCondition::ObjectBoxNmsCondition
                  ((ObjectBoxNmsCondition *)&stack0xffffffffffffffc0,first,in_XMM0_Da);
        in_stack_ffffffffffffffb8 = local_38;
        in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffb0;
        SafeOrderList<ncnn::ObjectBox>::remove_all_match<ncnn::ObjectBoxNmsCondition>
                  (unaff_retaddr,in_stack_00000008);
        do_object_boxs_table_nms
                  ((ObjectsManager *)CONCAT44(iVar2,iVar3),(ObjectBoxNmsCondition *)condition_00,
                   (int)((ulong)first >> 0x20),(int)first);
        bVar1 = SafeOrderList<ncnn::ObjectBox>::empty(in_stack_ffffffffffffffc0);
      } while (((bVar1 ^ 0xffU) & 1) != 0);
    }
  }
  return;
}

Assistant:

void ObjectsManager::do_objects_nms(std::vector<ObjectBox> &objects, float nms, float prob_threh)
{
    objects.clear();
    int start = prob_steps - 1;
    int min_index = get_prob_index(prob_threh);
    for (; start >= min_index; start--)
    {
        TObjectBoxs &object_boxs = *object_boxs_table[start];
        if (object_boxs.empty())
        {
            continue;
        }

        do
        {
            ObjectBox &object_box = object_boxs.front();
            objects.push_back(object_box);
            object_boxs.pop_front();

            ObjectBoxNmsCondition condition(object_box, nms);
            object_boxs.remove_all_match(condition);

            do_object_boxs_table_nms(condition, min_index, start);
        } while (!object_boxs.empty());
    }
}